

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mipmapped_texture::resize
          (mipmapped_texture *this,uint new_width,uint new_height,resample_params *params)

{
  elemental_vector *this_00;
  int iVar1;
  color_quad<unsigned_char,_int> *p;
  void *p_00;
  bool bVar2;
  uint uVar3;
  mip_level *pmVar4;
  image_u8 *src;
  image_u8 *dst;
  vector<crnlib::mip_level_*> *pvVar5;
  vector<crnlib::mip_level_*> *pvVar6;
  uint f;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  face_vec faces;
  image_u8 tmp;
  face_vec local_b8;
  mipmapped_texture *local_a8;
  uint local_a0;
  uint local_9c;
  resample_params *local_98;
  resample_params local_90;
  image_u8 local_68;
  
  uVar3 = (this->m_faces).m_size;
  if (uVar3 == 0) {
    bVar2 = false;
  }
  else {
    local_b8.m_p = (vector<crnlib::mip_level_*> *)0x0;
    local_b8.m_size = 0;
    local_b8.m_capacity = 0;
    local_a8 = this;
    local_a0 = new_width;
    local_9c = new_height;
    local_98 = params;
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_b8,uVar3,uVar3 == 1,0x10,(object_mover)0x0,false);
    if (uVar3 != local_b8.m_size) {
      memset(local_b8.m_p + (local_b8._8_8_ & 0xffffffff),0,(ulong)(uVar3 - local_b8.m_size) << 4);
    }
    local_b8.m_size = uVar3;
    lVar9 = 0;
    uVar7 = 0;
    do {
      iVar1 = *(int *)((long)&(local_b8.m_p)->m_size + lVar9);
      if (iVar1 != 1) {
        this_00 = (elemental_vector *)((long)&(local_b8.m_p)->m_p + lVar9);
        if (iVar1 == 0) {
          uVar3 = 0;
          if (*(int *)((long)&(local_b8.m_p)->m_capacity + lVar9) == 0) {
            elemental_vector::increase_capacity(this_00,1,true,8,(object_mover)0x0,false);
            uVar3 = this_00->m_size;
          }
          memset((void *)((ulong)uVar3 * 8 + (long)this_00->m_p),0,(ulong)(1 - uVar3) << 3);
        }
        this_00->m_size = 1;
      }
      pmVar4 = (mip_level *)crnlib_malloc(0x28);
      mip_level::mip_level(pmVar4);
      **(undefined8 **)((long)&(local_b8.m_p)->m_p + lVar9) = pmVar4;
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (uVar7 < (local_b8._8_8_ & 0xffffffff));
    if (local_b8.m_size != 0) {
      uVar7 = 0;
      do {
        local_68.m_width = 0;
        local_68.m_height = 0;
        local_68.m_pitch = 0;
        local_68.m_total = 0;
        local_68.m_comp_flags = 0xf;
        local_68.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        local_68.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
        local_68.m_pixel_buf.m_size = 0;
        local_68.m_pixel_buf.m_capacity = 0;
        src = mip_level::get_unpacked_image(*(local_a8->m_faces).m_p[uVar7].m_p,&local_68,1);
        dst = (image_u8 *)crnlib_malloc(0x30);
        dst->m_width = 0;
        dst->m_height = 0;
        dst->m_pitch = 0;
        dst->m_total = 0;
        dst->m_comp_flags = 0xf;
        dst->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
        (dst->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
        (dst->m_pixel_buf).m_size = 0;
        (dst->m_pixel_buf).m_capacity = 0;
        local_90.m_dst_width = local_a0;
        local_90.m_dst_height = local_9c;
        local_90.m_filter_scale = local_98->m_filter_scale;
        local_90.m_first_comp = 0;
        local_90.m_source_gamma = 2.2;
        local_90.m_num_comps = 4 - ((src->m_comp_flags & 8) == 0);
        local_90.m_wrapping = local_98->m_wrapping;
        local_90.m_srgb = local_98->m_srgb;
        local_90.m_pFilter = local_98->m_pFilter;
        local_90.m_multithreaded = local_98->m_multithreaded;
        bVar2 = image_utils::resample(src,dst,&local_90);
        if (bVar2) {
          if (local_98->m_renormalize == true) {
            image_utils::renorm_normal_map(dst);
          }
          dst->m_comp_flags = src->m_comp_flags;
          mip_level::assign(*local_b8.m_p[uVar7].m_p,dst,PIXEL_FMT_INVALID,
                            (*(local_a8->m_faces).m_p[uVar7].m_p)->m_orient_flags);
        }
        else {
          p = (dst->m_pixel_buf).m_p;
          if (p != (color_quad<unsigned_char,_int> *)0x0) {
            crnlib_free(p);
          }
          crnlib_free(dst);
          if (local_b8.m_size != 0) {
            uVar10 = 0;
            pvVar5 = local_b8.m_p;
            pvVar6 = local_b8.m_p;
            uVar3 = local_b8.m_size;
            do {
              if (pvVar6[uVar10].m_size != 0) {
                uVar8 = 0;
                do {
                  pmVar4 = pvVar6[uVar10].m_p[uVar8];
                  if (pmVar4 != (mip_level *)0x0) {
                    mip_level::~mip_level(pmVar4);
                    crnlib_free(pmVar4);
                    pvVar5 = local_b8.m_p;
                  }
                  uVar8 = uVar8 + 1;
                  pvVar6 = pvVar5;
                } while (uVar8 < pvVar5[uVar10].m_size);
                uVar3 = local_b8.m_size;
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < uVar3);
          }
        }
        if (local_68.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(local_68.m_pixel_buf.m_p);
        }
        if (!bVar2) {
          bVar2 = false;
          goto LAB_0013e2cf;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (local_b8._8_8_ & 0xffffffff));
    }
    bVar2 = true;
    assign(local_a8,&local_b8);
LAB_0013e2cf:
    pvVar6 = local_b8.m_p;
    if (local_b8.m_p != (vector<crnlib::mip_level_*> *)0x0) {
      uVar7 = local_b8._8_8_ & 0xffffffff;
      if (uVar7 != 0) {
        lVar9 = 0;
        do {
          p_00 = *(void **)((long)&pvVar6->m_p + lVar9);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar9 = lVar9 + 0x10;
        } while (uVar7 << 4 != lVar9);
      }
      crnlib_free(local_b8.m_p);
    }
  }
  return bVar2;
}

Assistant:

bool mipmapped_texture::resize(uint new_width, uint new_height, const resample_params& params) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  CRNLIB_ASSERT((new_width >= 1) && (new_height >= 1));

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(1);
    faces[f][0] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    image_u8* pMip = crnlib_new<image_u8>();

    image_utils::resample_params rparams;
    rparams.m_dst_width = new_width;
    rparams.m_dst_height = new_height;
    rparams.m_filter_scale = params.m_filter_scale;
    rparams.m_first_comp = 0;
    rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
    rparams.m_srgb = params.m_srgb;
    rparams.m_wrapping = params.m_wrapping;
    rparams.m_pFilter = params.m_pFilter;
    rparams.m_multithreaded = params.m_multithreaded;

    if (!image_utils::resample(*pImg, *pMip, rparams)) {
      crnlib_delete(pMip);

      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);

      return false;
    }

    if (params.m_renormalize)
      image_utils::renorm_normal_map(*pMip);

    pMip->set_comp_flags(pImg->get_comp_flags());

    faces[f][0]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}